

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# search.cc
# Opt level: O0

stringstream * __thiscall Search::search::output_abi_cxx11_(search *this)

{
  search *this_local;
  stringstream *local_8;
  
  if ((this->priv->should_produce_string & 1U) == 0) {
    local_8 = this->priv->bad_string_stream;
  }
  else if (this->priv->state == GET_TRUTH_STRING) {
    local_8 = this->priv->truth_string;
  }
  else {
    local_8 = this->priv->pred_string;
  }
  return local_8;
}

Assistant:

stringstream& search::output()
{
  if (!this->priv->should_produce_string)
    return *(this->priv->bad_string_stream);
  else if (this->priv->state == GET_TRUTH_STRING)
    return *(this->priv->truth_string);
  else
    return *(this->priv->pred_string);
}